

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O3

Vector * BiCGSTABIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType PrecondProc,
                     double OmegaPrecond)

{
  double bNorm;
  double dVar1;
  double dVar2;
  Boolean BVar3;
  LASErrIdType LVar4;
  size_t Dim;
  Vector *pVVar5;
  Vector *pVVar6;
  int iVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Vector p;
  Vector r_;
  Vector v;
  Vector p_;
  Vector r;
  Vector t;
  Vector s_;
  Vector s;
  undefined1 local_228 [32];
  undefined1 local_208 [16];
  double local_1c8;
  Vector local_1b0;
  Vector local_180;
  Vector local_150;
  Vector local_120;
  Vector local_f0;
  Vector local_c0;
  Vector local_90;
  Vector local_60;
  
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  Dim = Q_GetDim(A);
  V_Constr(&local_f0,"r",Dim,Normal,True);
  V_Constr(&local_180,"r_",Dim,Normal,True);
  V_Constr(&local_1b0,"p",Dim,Normal,True);
  V_Constr(&local_150,"v",Dim,Normal,True);
  V_Constr(&local_60,"s",Dim,Normal,True);
  V_Constr(&local_c0,"t",Dim,Normal,True);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar3 = Q_KerDefined(A), BVar3 != False)) {
    V_Constr(&local_120,"p_",Dim,Normal,True);
    V_Constr(&local_90,"s_",Dim,Normal,True);
  }
  LVar4 = LASResult();
  if (LVar4 != LASOK) goto LAB_0010a84f;
  bNorm = l2Norm_V(b);
  dVar1 = l1Norm_V(x);
  auVar9._8_4_ = (int)(Dim >> 0x20);
  auVar9._0_8_ = Dim;
  auVar9._12_4_ = 0x45300000;
  pVVar5 = b;
  if (2.2250738585072014e-307 <=
      ABS(dVar1 / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)Dim) - 4503599627370496.0)))) {
    BVar3 = Q_KerDefined(A);
    if (BVar3 != False) {
      OrthoRightKer_VQ(x,A);
    }
    pVVar5 = Mul_QV(A,x);
    pVVar5 = Sub_VV(b,pVVar5);
  }
  Asgn_VV(&local_f0,pVVar5);
  if ((PrecondProc == (PrecondProcType)0x0) && (BVar3 = Q_KerDefined(A), BVar3 == False)) {
    Asgn_VV(&local_180,&local_f0);
    local_228._0_16_ = ZEXT816(0);
    iVar7 = 0;
    local_208 = ZEXT816(0);
    do {
      auVar9 = local_208;
      dVar1 = l2Norm_V(&local_f0);
      BVar3 = RTCResult(iVar7,dVar1,bNorm,BiCGSTABIterId);
      if ((BVar3 != False) || (MaxIter <= iVar7)) break;
      dVar1 = Mul_VV(&local_180,&local_f0);
      local_208._12_4_ = extraout_XMM0_Dd;
      local_208._8_4_ = extraout_XMM0_Dc;
      if (ABS(dVar1) < 2.2250738585072014e-307) goto LAB_0010a816;
      if (iVar7 == 0) {
        Asgn_VV(&local_1b0,&local_f0);
      }
      else {
        local_208._0_8_ = auVar9._0_8_;
        auVar10._8_8_ = local_208._0_8_;
        auVar10._0_8_ = dVar1;
        auVar9 = divpd(auVar10,local_228._0_16_);
        pVVar5 = Mul_SV(local_228._8_8_,&local_150);
        pVVar5 = Sub_VV(&local_1b0,pVVar5);
        pVVar5 = Mul_SV(auVar9._8_8_ * auVar9._0_8_,pVVar5);
        pVVar5 = Add_VV(&local_f0,pVVar5);
        Asgn_VV(&local_1b0,pVVar5);
      }
      pVVar5 = Mul_QV(A,&local_1b0);
      Asgn_VV(&local_150,pVVar5);
      local_208._0_8_ = Mul_VV(&local_180,&local_150);
      local_208._0_8_ = dVar1 / (double)local_208._0_8_;
      pVVar5 = Mul_SV((double)local_208._0_8_,&local_150);
      pVVar5 = Sub_VV(&local_f0,pVVar5);
      Asgn_VV(&local_60,pVVar5);
      pVVar5 = Mul_QV(A,&local_60);
      Asgn_VV(&local_c0,pVVar5);
      local_228._8_8_ = Mul_VV(&local_c0,&local_60);
      dVar2 = l2Norm_V(&local_c0);
      local_228._8_8_ = (double)local_228._8_8_ / (dVar2 * dVar2);
      pVVar5 = Mul_SV((double)local_208._0_8_,&local_1b0);
      pVVar6 = Mul_SV((double)local_228._8_8_,&local_60);
      pVVar5 = Add_VV(pVVar5,pVVar6);
      AddAsgn_VV(x,pVVar5);
      pVVar5 = Mul_SV((double)local_228._8_8_,&local_c0);
      pVVar5 = Sub_VV(&local_60,pVVar5);
      Asgn_VV(&local_f0,pVVar5);
      iVar7 = iVar7 + 1;
      local_228._0_8_ = dVar1;
    } while (2.2250738585072014e-307 <= ABS((double)local_228._8_8_));
  }
  else {
    Asgn_VV(&local_180,&local_f0);
    local_228._0_16_ = ZEXT816(0);
    iVar7 = 0;
    local_1c8 = 0.0;
    do {
      dVar1 = l2Norm_V(&local_f0);
      BVar3 = RTCResult(iVar7,dVar1,bNorm,BiCGSTABIterId);
      if ((BVar3 != False) || (MaxIter <= iVar7)) break;
      dVar1 = Mul_VV(&local_180,&local_f0);
      if (ABS(dVar1) < 2.2250738585072014e-307) goto LAB_0010a816;
      pVVar5 = &local_f0;
      if (iVar7 != 0) {
        auVar8._8_8_ = local_1c8;
        auVar8._0_8_ = dVar1;
        auVar9 = divpd(auVar8,local_228._0_16_);
        pVVar5 = Mul_SV(local_228._8_8_,&local_150);
        pVVar5 = Sub_VV(&local_1b0,pVVar5);
        pVVar5 = Mul_SV(auVar9._8_8_ * auVar9._0_8_,pVVar5);
        pVVar5 = Add_VV(&local_f0,pVVar5);
      }
      Asgn_VV(&local_1b0,pVVar5);
      if (PrecondProc == (PrecondProcType)0x0) {
        Asgn_VV(&local_120,&local_1b0);
      }
      else {
        (*PrecondProc)(A,&local_120,&local_1b0,OmegaPrecond);
      }
      BVar3 = Q_KerDefined(A);
      if (BVar3 != False) {
        OrthoRightKer_VQ(&local_120,A);
      }
      pVVar5 = Mul_QV(A,&local_120);
      Asgn_VV(&local_150,pVVar5);
      local_1c8 = Mul_VV(&local_180,&local_150);
      local_1c8 = dVar1 / local_1c8;
      pVVar5 = Mul_SV(local_1c8,&local_150);
      pVVar5 = Sub_VV(&local_f0,pVVar5);
      Asgn_VV(&local_60,pVVar5);
      if (PrecondProc == (PrecondProcType)0x0) {
        Asgn_VV(&local_90,&local_60);
      }
      else {
        (*PrecondProc)(A,&local_90,&local_60,OmegaPrecond);
      }
      BVar3 = Q_KerDefined(A);
      if (BVar3 != False) {
        OrthoRightKer_VQ(&local_90,A);
      }
      pVVar5 = Mul_QV(A,&local_90);
      Asgn_VV(&local_c0,pVVar5);
      local_228._8_8_ = Mul_VV(&local_c0,&local_60);
      dVar2 = l2Norm_V(&local_c0);
      local_228._8_8_ = (double)local_228._8_8_ / (dVar2 * dVar2);
      pVVar5 = Mul_SV(local_1c8,&local_120);
      pVVar6 = Mul_SV((double)local_228._8_8_,&local_90);
      pVVar5 = Add_VV(pVVar5,pVVar6);
      AddAsgn_VV(x,pVVar5);
      pVVar5 = Mul_SV((double)local_228._8_8_,&local_c0);
      pVVar5 = Sub_VV(&local_60,pVVar5);
      Asgn_VV(&local_f0,pVVar5);
      iVar7 = iVar7 + 1;
      local_228._0_8_ = dVar1;
    } while (2.2250738585072014e-307 <= ABS((double)local_228._8_8_));
  }
LAB_0010a833:
  BVar3 = Q_KerDefined(A);
  if (BVar3 != False) {
    OrthoRightKer_VQ(x,A);
  }
LAB_0010a84f:
  V_Destr(&local_f0);
  V_Destr(&local_180);
  V_Destr(&local_1b0);
  V_Destr(&local_150);
  V_Destr(&local_60);
  V_Destr(&local_c0);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar3 = Q_KerDefined(A), BVar3 != False)) {
    V_Destr(&local_120);
    V_Destr(&local_90);
  }
  Q_Unlock(A);
  V_Unlock(x);
  V_Unlock(b);
  return x;
LAB_0010a816:
  LASError(LASBreakdownErr,"BiCGSTABIter","Rho",(char *)0x0,(char *)0x0);
  goto LAB_0010a833;
}

Assistant:

Vector *BiCGSTABIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType PrecondProc, double OmegaPrecond)
{
    /*
     *  for details to the algorithm see
     *
     *  R. Barrett, M. Berry, T. F. Chan, J. Demmel, J. Donato, J. Dongarra,
     *  V. Eijkhout, R. Pozo, Ch. Romine, H. van der Vorst:
     *  Templates for the Solution of Linear Systems: Building Blocks
     *  for Iterative Solvers;
     *  SIAM, Philadelphia, 1994
     *
     */

    int Iter;
    double Alpha = 0.0, Beta, Rho, RhoOld = 0.0, Omega = 0.0;
    double bNorm;
    size_t Dim;
    Vector r, r_, p, p_, v, s, s_, t;

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    Dim = Q_GetDim(A);
    V_Constr(&r, "r", Dim, Normal, True);
    V_Constr(&r_, "r_", Dim, Normal, True);
    V_Constr(&p, "p", Dim, Normal, True);
    V_Constr(&v, "v", Dim, Normal, True);
    V_Constr(&s, "s", Dim, Normal, True);
    V_Constr(&t, "t", Dim, Normal, True);
    if (PrecondProc != NULL || Q_KerDefined(A)) {
        V_Constr(&p_, "p_", Dim, Normal, True);
        V_Constr(&s_, "s_", Dim, Normal, True);
    }
    
    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);

        Iter = 0;
        /* r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&r, b);
	}
        if (PrecondProc != NULL || Q_KerDefined(A)) {
            /* preconditioned BiCGStab */
            Asgn_VV(&r_, &r);
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, BiCGSTABIterId)
                && Iter < MaxIter) {
                Iter++;
                Rho = Mul_VV(&r_, &r);
                if (IsZero(Rho)) {
                    LASError(LASBreakdownErr, "BiCGSTABIter", "Rho", NULL, NULL);
                    break;
                }
                if (Iter == 1) {
                    Asgn_VV(&p, &r);
                } else {
                    Beta = (Rho / RhoOld) * (Alpha / Omega);
                    Asgn_VV(&p, Add_VV(&r, Mul_SV(Beta, Sub_VV(&p, Mul_SV(Omega, &v)))));
                }
	        if (PrecondProc != NULL)
                    (*PrecondProc)(A, &p_, &p, OmegaPrecond);
	        else
		    Asgn_VV(&p_, &p);
		if (Q_KerDefined(A))
		   OrthoRightKer_VQ(&p_, A);
                Asgn_VV(&v, Mul_QV(A, &p_));
                Alpha = Rho / Mul_VV(&r_, &v);
                Asgn_VV(&s, Sub_VV(&r, Mul_SV(Alpha, &v)));
	        if (PrecondProc != NULL)
                    (*PrecondProc)(A, &s_, &s, OmegaPrecond);
	        else
		    Asgn_VV(&s_, &s);
		if (Q_KerDefined(A))
		   OrthoRightKer_VQ(&s_, A);
                Asgn_VV(&t, Mul_QV(A, &s_));
                Omega = Mul_VV(&t, &s) / pow(l2Norm_V(&t), 2.0);
                AddAsgn_VV(x, Add_VV(Mul_SV(Alpha, &p_), Mul_SV(Omega, &s_)));
                Asgn_VV(&r, Sub_VV(&s, Mul_SV(Omega, &t)));
                RhoOld = Rho;
                if (IsZero(Omega))
                    break;
            }
        } else {
            /* plain BiCGStab (p_ = p) */
            Asgn_VV(&r_, &r);
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, BiCGSTABIterId)
                && Iter < MaxIter) {
                Iter++;
                Rho = Mul_VV(&r_, &r);
                if (IsZero(Rho)) {
                    LASError(LASBreakdownErr, "BiCGSTABIter", "Rho", NULL, NULL);
                    break;
                }
                if (Iter == 1) {
                    Asgn_VV(&p, &r);
                } else {
                    Beta = (Rho / RhoOld) * (Alpha / Omega);
                    Asgn_VV(&p, Add_VV(&r, Mul_SV(Beta, Sub_VV(&p, Mul_SV(Omega, &v)))));
                }
                Asgn_VV(&v, Mul_QV(A, &p));
                Alpha = Rho / Mul_VV(&r_, &v);
                Asgn_VV(&s, Sub_VV(&r, Mul_SV(Alpha, &v)));
                Asgn_VV(&t, Mul_QV(A, &s));
                Omega = Mul_VV(&t, &s) / pow(l2Norm_V(&t), 2.0);
                AddAsgn_VV(x, Add_VV(Mul_SV(Alpha, &p), Mul_SV(Omega, &s)));
                Asgn_VV(&r, Sub_VV(&s, Mul_SV(Omega, &t)));
                RhoOld = Rho;
                if (IsZero(Omega))
                    break;
            }
        }
        if (Q_KerDefined(A))
	   OrthoRightKer_VQ(x, A);
    }

    V_Destr(&r);
    V_Destr(&r_);
    V_Destr(&p);
    V_Destr(&v);
    V_Destr(&s);
    V_Destr(&t);
    if (PrecondProc != NULL || Q_KerDefined(A)) {
        V_Destr(&p_);
        V_Destr(&s_);
    }
    
    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}